

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O0

undefined8 get_diget<cppcms::crypto::message_digest>(message_digest *d,string *source)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RSI;
  undefined8 in_RDI;
  uint n;
  uchar buf [256];
  undefined1 local_118 [8];
  size_t in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::size();
  (**(code **)(*in_RSI + 0x20))(in_RSI,uVar1,uVar2);
  (**(code **)(*in_RSI + 0x10))();
  (**(code **)(*in_RSI + 0x28))(in_RSI,local_118);
  to_string_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

std::string get_diget(MD &d,std::string const &source)
{
	unsigned char buf[256];
	d.append(source.c_str(),source.size());
	unsigned n=d.digest_size();
	d.readout(buf);
	return to_string(buf,n);
}